

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  uint32_t hash;
  uint uVar4;
  LRUHandle **ppLVar5;
  MutexLock l;
  MutexLock local_28;
  
  hash = HashSlice(key);
  uVar4 = hash >> 0x1c;
  local_28.mu_ = &this->shard_[uVar4].mutex_;
  port::Mutex::Lock(local_28.mu_);
  ppLVar5 = HandleTable::FindPointer(&this->shard_[uVar4].table_,key,hash);
  pLVar1 = *ppLVar5;
  if (pLVar1 != (LRUHandle *)0x0) {
    pLVar1->refs = pLVar1->refs + 1;
    pLVar2 = pLVar1->next;
    pLVar3 = pLVar1->prev;
    pLVar2->prev = pLVar3;
    pLVar3->next = pLVar2;
    pLVar1->next = &this->shard_[uVar4].lru_;
    pLVar2 = this->shard_[uVar4].lru_.prev;
    pLVar1->prev = pLVar2;
    pLVar2->next = pLVar1;
    pLVar1->next->prev = pLVar1;
  }
  MutexLock::~MutexLock(&local_28);
  return (Handle *)pLVar1;
}

Assistant:

virtual Handle *Lookup(const Slice &key) {
                const uint32_t hash = HashSlice(key);
                return shard_[Shard(hash)].Lookup(key, hash);
            }